

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  ImGuiContext *pIVar1;
  char *label_00;
  bool bVar2;
  float fVar3;
  ImVec2 local_94;
  byte local_89;
  char *pcStack_88;
  bool item_selected;
  char *item_text;
  int i;
  undefined1 local_70 [8];
  ImGuiListClipper clipper;
  bool value_changed;
  ImVec2 size;
  float height_in_items_f;
  ImGuiContext *g;
  int height_in_items_local;
  int items_count_local;
  void *data_local;
  _func_bool_void_ptr_int_char_ptr_ptr *items_getter_local;
  int *current_item_local;
  char *label_local;
  
  pIVar1 = GImGui;
  g._0_4_ = height_in_items;
  if (height_in_items < 0) {
    g._0_4_ = ImMin<int>(items_count,7);
  }
  fVar3 = GetTextLineHeightWithSpacing();
  fVar3 = ImFloor(fVar3 * ((float)(int)g + 0.25) + (pIVar1->Style).FramePadding.y * 2.0);
  ImVec2::ImVec2((ImVec2 *)((long)&clipper.TempData + 4),0.0,fVar3);
  bVar2 = BeginListBox(label,(ImVec2 *)((long)&clipper.TempData + 4));
  if (bVar2) {
    clipper.TempData._3_1_ = 0;
    ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_70);
    fVar3 = GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin((ImGuiListClipper *)local_70,items_count,fVar3);
    while (bVar2 = ImGuiListClipper::Step((ImGuiListClipper *)local_70), bVar2) {
      for (item_text._0_4_ = local_70._0_4_; (int)item_text < (int)local_70._4_4_;
          item_text._0_4_ = (int)item_text + 1) {
        bVar2 = (*items_getter)(data,(int)item_text,&stack0xffffffffffffff78);
        if (!bVar2) {
          pcStack_88 = "*Unknown item*";
        }
        PushID((int)item_text);
        label_00 = pcStack_88;
        bVar2 = (int)item_text == *current_item;
        local_89 = bVar2;
        ImVec2::ImVec2(&local_94,0.0,0.0);
        bVar2 = Selectable(label_00,bVar2,0,&local_94);
        if (bVar2) {
          *current_item = (int)item_text;
          clipper.TempData._3_1_ = 1;
        }
        if ((local_89 & 1) != 0) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    EndListBox();
    if ((clipper.TempData._3_1_ & 1) != 0) {
      MarkItemEdited((pIVar1->LastItemData).ID);
    }
    label_local._7_1_ = (bool)(clipper.TempData._3_1_ & 1);
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_70);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Calculate size from "height_in_items"
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items + 0.25f;
    ImVec2 size(0.0f, ImFloor(GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f));

    if (!BeginListBox(label, size))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different height,
    // you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper;
    clipper.Begin(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            const bool item_selected = (i == *current_item);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    EndListBox();

    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}